

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O2

unsigned_long
arangodb::velocypack::readIntegerNonEmpty<unsigned_long>(uint8_t *start,ValueLength length)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  switch(length) {
  case 1:
    return (ulong)*start;
  case 2:
    return (ulong)*(ushort *)start;
  case 3:
    uVar3 = (ulong)*(ushort *)(start + 1) << 8;
    uVar2 = (ulong)*start;
    goto LAB_0010a7df;
  case 4:
    return (ulong)*(uint *)start;
  case 5:
    uVar1 = *(uint *)start;
    uVar2 = (ulong)start[4];
    break;
  case 6:
    uVar1 = *(uint *)start;
    uVar2 = (ulong)*(ushort *)(start + 4);
    break;
  case 7:
    uVar3 = (ulong)*(uint3 *)(start + 4) << 0x20;
    uVar2 = (ulong)*(uint *)start;
    goto LAB_0010a7df;
  case 8:
    return *(unsigned_long *)start;
  default:
    return 0;
  }
  uVar3 = (ulong)uVar1;
  uVar2 = uVar2 << 0x20;
LAB_0010a7df:
  return uVar2 | uVar3;
}

Assistant:

static inline T readIntegerNonEmpty(uint8_t const* start,
                                    ValueLength length) noexcept {
  static_assert(std::is_unsigned<T>::value, "result type must be unsigned");
  VELOCYPACK_ASSERT(length > 0);
  VELOCYPACK_ASSERT(length <= sizeof(T));
  VELOCYPACK_ASSERT(length <= 8);
  switch (length) {
    case 1:
      return *start;
    case 2:
      return readIntegerFixed<T, 2>(start);
    case 3:
      return readIntegerFixed<T, 3>(start);
    case 4:
      return readIntegerFixed<T, 4>(start);
    case 5:
      return readIntegerFixed<T, 5>(start);
    case 6:
      return readIntegerFixed<T, 6>(start);
    case 7:
      return readIntegerFixed<T, 7>(start);
    case 8:
      return readIntegerFixed<T, 8>(start);
  }
  VELOCYPACK_ASSERT(false);
  return 0;
}